

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O2

string * __thiscall Vertex::getSequence_abi_cxx11_(string *__return_storage_ptr__,Vertex *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->seq);
  return __return_storage_ptr__;
}

Assistant:

string Vertex::getSequence(){
    return this->seq;
}